

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void variance_double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  double *in_stack_ffffffffffffff88;
  double local_70;
  ulong local_68;
  moment_variance<double> filter;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::basic_moment
            (&filter,0.125,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x1a4,"void variance_double_suite::test_exponential_increase()",&local_68,&local_70);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a5,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,predicate
            );
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,10.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 5.8;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a7,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_00);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 10.08;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","10.08","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a8,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,100.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 41.4734;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","41.4734","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1aa,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_02);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 1486.96;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1486.96","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ab,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1000.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 331.01;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","331.01","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ad,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_04);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 164617.0;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","164617.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ae,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,10000.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 2812.32;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2812.32","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b0,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_06);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 17044900.0;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.70449e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b1,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,100000.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 24852.2;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","24852.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b3,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_08);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 1729330000.0;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.72933e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b4,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_09);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1000000.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 225565.0;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","225565.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b6,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_10);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 174265000000.0;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.74265e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b7,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,10000000.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 2086960.0;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08696e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b9,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_12);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 17521400000000.0;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.75214e13","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ba,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_13);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,100000000.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 19587900.0;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.95879e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bc,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_14);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 1.76054e+15;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76054e15","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bd,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_15);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1000000000.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 185889000.0;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.85889e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bf,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_16);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 1.76876e+17;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 0.0001;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76876e17","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1c0,0x10c6a7,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_17);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-4);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 10.08, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 41.4734, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1486.96, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 331.01, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 164617., tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2812.32, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.70449e7, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 24852.2, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.72933e9, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 225565.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.74265e11, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 2.08696e6, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.75214e13, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 1.95879e7, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76054e15, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.85889e8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76876e17, tolerance);
}